

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
parse_query_item(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  curi_status cVar6;
  char *pcVar7;
  curi_settings *settings_00;
  size_t valueLen;
  void *pvVar8;
  size_t previousOffset;
  
  sVar3 = *offset;
  settings_00 = (curi_settings *)0x1;
  pvVar8 = userData;
switchD_00102a2e_caseD_21:
  uVar4 = *offset;
  if (((ulong)settings_00 & 1) != 0) {
    pcVar7 = uri + uVar4;
    if (len <= uVar4) {
      pcVar7 = "";
    }
    *offset = uVar4 + 1;
    bVar1 = *pcVar7;
    if (((bVar1 != settings->query_item_separator) && (bVar1 != settings->query_item_key_separator))
       && (bVar1 - 0x21 < 0x5e)) goto code_r0x00102a25;
    goto switchD_00102a2e_caseD_22;
  }
  cVar2 = settings->query_item_key_separator;
  pcVar7 = uri + uVar4;
  if (len <= uVar4) {
    pcVar7 = "";
  }
  pvVar8 = (void *)(uVar4 + 1);
  *offset = (size_t)pvVar8;
  if (*pcVar7 == cVar2) {
switchD_00102ab5_caseD_21:
    uVar5 = *offset;
    pcVar7 = uri + uVar5;
    if (len <= uVar5) {
      pcVar7 = "";
    }
    *offset = (size_t)(uVar5 + 1);
    if (*pcVar7 == settings->query_item_separator) goto switchD_00102ab5_caseD_22;
    switch(*pcVar7) {
    case '!':
    case '$':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
    case '-':
    case '.':
    case '/':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case ':':
    case ';':
    case '=':
    case '?':
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '_':
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
    case '~':
      goto switchD_00102ab5_caseD_21;
    default:
      goto switchD_00102ab5_caseD_22;
    case '%':
      cVar6 = parse_h8(uri,len,offset,(curi_settings *)(uVar5 + 1),pvVar8);
      if (cVar6 != curi_status_success) goto switchD_00102ab5_caseD_22;
      goto switchD_00102ab5_caseD_21;
    }
  }
  *offset = uVar4;
  pcVar7 = (char *)0x0;
  valueLen = 0;
LAB_00102b23:
  cVar6 = handle_query_item(uri + sVar3,uVar4 - sVar3,pcVar7,valueLen,settings,userData);
  return cVar6;
code_r0x00102a25:
  settings_00 = (curi_settings *)CONCAT71((int7)(uVar4 + 1 >> 8),1);
  switch((uint)bVar1) {
  case 0x25:
    cVar6 = parse_h8(uri,len,offset,settings_00,pvVar8);
    settings_00 = (curi_settings *)0x1;
    if (cVar6 == curi_status_success) break;
  case 0x22:
  case 0x23:
  case 0x3c:
  case 0x3e:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x60:
  case 0x7b:
  case 0x7c:
  case 0x7d:
switchD_00102a2e_caseD_22:
    *offset = uVar4;
    settings_00 = (curi_settings *)0x0;
  }
  goto switchD_00102a2e_caseD_21;
switchD_00102ab5_caseD_22:
  *offset = uVar5;
  pcVar7 = uri + (long)pvVar8;
  valueLen = uVar5 - (long)pvVar8;
  goto LAB_00102b23;
}

Assistant:

static curi_status parse_query_item(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // query_item = query_item_key [query_item_key_separator query_item_value]
    // query_item_key = *query_fragment_char (but no query_item_separator or query_item_key_separator)
    // query_item_separator = settings->query_item_separator (default is "&")
    // query_item_key_separator = settings->query_item_key_separator (default is "=")
    // query_item_value = *query_fragment_char (but no query_item_separator)

    const size_t keyStartOffset = *offset;
    size_t keyEndOffset;

    curi_status status = curi_status_success;
    while (status == curi_status_success)
    {
        size_t previousOffset = *offset;

        char c = *read_char(uri, len, offset);
        if (c == settings->query_item_separator)
            status = curi_status_error;
        else if (c == settings->query_item_key_separator)
            status = curi_status_error;
        else
        {
            switch (c)
            {
                CASE_QUERY_FRAGMENT_CHAR_NO_PCT:
                    status = curi_status_success;
                    break;
                case '%':
                    status = parse_h8(uri, len, offset, settings, userData);
                    break;
                default:
                    status = curi_status_error;
                    break;
            }
        }

        if (status != curi_status_success)
            *offset = previousOffset;
    };

    keyEndOffset = *offset;

    status = parse_char(settings->query_item_key_separator, uri, len, offset, settings, userData);

    if (status == curi_status_success)
    {
        // There is a value
        const size_t valueStartOffset = *offset;

        while (status == curi_status_success)
        {
            size_t previousOffset = *offset;

            char c = *read_char(uri, len, offset);
            if (c == settings->query_item_separator)
                status = curi_status_error;
            else
            {
                switch (c)
                {
                    CASE_QUERY_FRAGMENT_CHAR_NO_PCT:
                        status = curi_status_success;
                        break;
                    case '%':
                        status = parse_h8(uri, len, offset, settings, userData);
                        break;
                    default:
                        status = curi_status_error;
                        break;
                }
            }

            if (status != curi_status_success)
                *offset = previousOffset;
        }

        status = handle_query_item(uri + keyStartOffset, keyEndOffset - keyStartOffset, uri + valueStartOffset, *offset - valueStartOffset, settings, userData);
    }
    else
    {
        *offset = keyEndOffset;
        // There is no value
        status = handle_query_item(uri + keyStartOffset, keyEndOffset - keyStartOffset, 0, 0, settings, userData);
    }

    return status;
}